

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

module_ * __thiscall
pybind11::module_::def<pybind11_init_pyhenson(pybind11::module_&)::__7>
          (module_ *this,char *name_,type *f)

{
  handle *in_RDX;
  char *in_RSI;
  handle *in_RDI;
  bool in_stack_0000001f;
  char *in_stack_00000020;
  module_ *in_stack_00000028;
  handle in_stack_00000030;
  cpp_function func;
  none *in_stack_ffffffffffffff90;
  scope *in_stack_ffffffffffffff98;
  handle in_stack_ffffffffffffffa0;
  handle in_stack_ffffffffffffffa8;
  handle this_00;
  scope local_30;
  name local_28 [5];
  
  pybind11::name::name(local_28,in_RSI);
  scope::scope(&local_30,in_RDI);
  none::none(in_stack_ffffffffffffff90);
  this_00.m_ptr = in_stack_ffffffffffffffa8.m_ptr;
  getattr(in_stack_ffffffffffffffa8,(char *)in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  sibling::sibling((sibling *)in_RDI,in_RDX);
  cpp_function::
  cpp_function<pybind11_init_pyhenson(pybind11::module_&)::__7,pybind11::name,pybind11::scope,pybind11::sibling,void>
            ((cpp_function *)this_00.m_ptr,(type *)in_stack_ffffffffffffffa8.m_ptr,
             (name *)in_stack_ffffffffffffffa0.m_ptr,in_stack_ffffffffffffff98,
             (sibling *)in_stack_ffffffffffffff90);
  object::~object((object *)0x299dfd);
  none::~none((none *)0x299e07);
  add_object(in_stack_00000028,in_stack_00000020,in_stack_00000030,in_stack_0000001f);
  cpp_function::~cpp_function((cpp_function *)0x299e36);
  return (module_ *)in_RDI;
}

Assistant:

module_ &def(const char *name_, Func &&f, const Extra &...extra) {
        cpp_function func(std::forward<Func>(f),
                          name(name_),
                          scope(*this),
                          sibling(getattr(*this, name_, none())),
                          extra...);
        // NB: allow overwriting here because cpp_function sets up a chain with the intention of
        // overwriting (and has already checked internally that it isn't overwriting
        // non-functions).
        add_object(name_, func, true /* overwrite */);
        return *this;
    }